

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O2

void ggml_vec_silu_f32(int n,float *y,float *x)

{
  undefined1 auVar3 [16];
  undefined4 in_register_0000003c;
  long lVar1;
  long lVar2;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar6;
  undefined1 auVar7 [16];
  __m512 in_stack_ffffffffffffff98;
  
  lVar2 = (long)n;
  for (lVar1 = 0; lVar1 + 0xf < lVar2; lVar1 = lVar1 + 0x10) {
    in_stack_ffffffffffffff98 = *(__m512 *)(x + lVar1);
    auVar4 = vsubps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),(undefined1  [64])in_stack_ffffffffffffff98
                           );
    ggml_v_expf((__m512 *)CONCAT44(in_register_0000003c,n),in_stack_ffffffffffffff98);
    auVar5._8_4_ = 0x3f800000;
    auVar5._0_8_ = 0x3f8000003f800000;
    auVar5._12_4_ = 0x3f800000;
    auVar5._16_4_ = 0x3f800000;
    auVar5._20_4_ = 0x3f800000;
    auVar5._24_4_ = 0x3f800000;
    auVar5._28_4_ = 0x3f800000;
    auVar5._32_4_ = 0x3f800000;
    auVar5._36_4_ = 0x3f800000;
    auVar5._40_4_ = 0x3f800000;
    auVar5._44_4_ = 0x3f800000;
    auVar5._48_4_ = 0x3f800000;
    auVar5._52_4_ = 0x3f800000;
    auVar5._56_4_ = 0x3f800000;
    auVar5._60_4_ = 0x3f800000;
    auVar5 = vaddps_avx512f(auVar4,auVar5);
    auVar5 = vdivps_avx512f((undefined1  [64])in_stack_ffffffffffffff98,auVar5);
    *(undefined1 (*) [64])(y + lVar1) = auVar5;
  }
  for (; lVar1 < lVar2; lVar1 = lVar1 + 1) {
    auVar7 = ZEXT416((uint)x[lVar1]);
    in_stack_ffffffffffffff98[0] = (float)auVar7._0_4_;
    in_stack_ffffffffffffff98[1] = (float)auVar7._4_4_;
    in_stack_ffffffffffffff98[2] = (float)auVar7._8_4_;
    in_stack_ffffffffffffff98[3] = (float)auVar7._12_4_;
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar3 = vxorps_avx512vl(auVar7,auVar3);
    fVar6 = expf(auVar3._0_4_);
    y[lVar1] = in_stack_ffffffffffffff98[0] / (fVar6 + 1.0);
  }
  return;
}

Assistant:

void ggml_vec_silu_f32(const int n, float * y, const float * x) {
    int i = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        _mm512_storeu_ps(y + i, ggml_v_silu(_mm512_loadu_ps(x + i)));
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        _mm256_storeu_ps(y + i, ggml_v_silu(_mm256_loadu_ps(x + i)));
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        _mm_storeu_ps(y + i, ggml_v_silu(_mm_loadu_ps(x + i)));
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        vst1q_f32(y + i, ggml_v_silu(vld1q_f32(x + i)));
    }
#endif
    for (; i < n; ++i) {
        y[i] = ggml_silu_f32(x[i]);
    }
}